

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeDPRRegListOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = Val >> 8 & 0x1f;
  uVar3 = Val >> 1 & 0x7f;
  DVar1 = MCDisassembler_Success;
  if (0x20 < uVar5 + uVar3 || uVar3 - 0x11 < 0xfffffff0) {
    if (0x20 < uVar5 + uVar3) {
      uVar3 = 0x20 - uVar5;
    }
    uVar4 = uVar3 + (uVar3 == 0);
    uVar3 = 0x10;
    if (uVar4 < 0x10) {
      uVar3 = uVar4;
    }
    DVar1 = MCDisassembler_SoftFail;
  }
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar5]);
  if (uVar3 != 1) {
    lVar2 = 0;
    if (uVar5 + 1 < 0x20) {
      MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar5 + 1]);
      lVar2 = 3;
    }
    DVar1 = (*(code *)((long)&DAT_003692a0 + (long)(int)(&DAT_003692a0)[lVar2]))();
    return DVar1;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeDPRRegListOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned i;
	unsigned Vd = fieldFromInstruction_4(Val, 8, 5);
	unsigned regs = fieldFromInstruction_4(Val, 1, 7);

	// In case of unpredictable encoding, tweak the operands.
	if (regs == 0 || regs > 16 || (Vd + regs) > 32) {
		regs = Vd + regs > 32 ? 32 - Vd : regs;
		regs = (1u > regs? 1u : regs);
		regs = (16u > regs? regs : 16u);
		S = MCDisassembler_SoftFail;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Vd, Address, Decoder)))
		return MCDisassembler_Fail;

	for (i = 0; i < (regs - 1); ++i) {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, ++Vd, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}